

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.hh
# Opt level: O2

void __thiscall tchecker::vm_t::push<int>(vm_t *this,int t)

{
  long local_8;
  
  local_8 = (long)t;
  std::vector<long,_std::allocator<long>_>::emplace_back<long>(&this->_stack,&local_8);
  return;
}

Assistant:

inline void push(T t)
  {
    if (!contains_value<tchecker::bytecode_t>(t))
      throw std::runtime_error("vm_t::push, value out-of-bounds");
    _stack.push_back(t);
  }